

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_mthd_invalid.cc
# Opt level: O0

void __thiscall hwtest::pgraph::anon_unknown_1::MthdInvalidTest::emulate_mthd(MthdInvalidTest *this)

{
  MthdInvalidTest *this_local;
  
  if (-1 < (long)((ulong)(this->super_MthdTest).super_StateTest.exp.invalid << 0x2f)) {
    (this->super_MthdTest).super_StateTest.exp.intr =
         (this->super_MthdTest).super_StateTest.exp.intr | 1;
    (this->super_MthdTest).super_StateTest.exp.invalid =
         (this->super_MthdTest).super_StateTest.exp.invalid | 1;
    if ((this->super_MthdTest).super_StateTest.super_RepeatTest.super_Test.chipset.card_type < 3) {
      (this->super_MthdTest).super_StateTest.exp.access =
           (this->super_MthdTest).super_StateTest.exp.access & 0xfffffefe;
    }
    else {
      (this->super_MthdTest).super_StateTest.exp.fifo_enable = 0;
      if (((-1 < (long)((ulong)(this->super_MthdTest).super_StateTest.exp.invalid << 0x3b)) &&
          ((long)((ulong)(this->super_MthdTest).super_StateTest.exp.notify << 0x2f) < 0)) &&
         (((ulong)(this->super_MthdTest).super_StateTest.exp.notify << 0x28) >> 0x3c != 0)) {
        (this->super_MthdTest).super_StateTest.exp.intr =
             (this->super_MthdTest).super_StateTest.exp.intr | 0x10000000;
      }
    }
  }
  return;
}

Assistant:

void emulate_mthd() override {
		if (!extr(exp.invalid, 16, 1)) {
			exp.intr |= 1;
			exp.invalid |= 1;
			if (chipset.card_type < 3) {
				exp.access &= ~0x101;
			} else {
				exp.fifo_enable = 0;
				if (!extr(exp.invalid, 4, 1)) {
					if (extr(exp.notify, 16, 1) && extr(exp.notify, 20, 4)) {
						exp.intr |= 1 << 28;
					}
				}
			}
		}
	}